

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_printer.c
# Opt level: O1

void flatcc_json_printer_struct_as_nested_root
               (flatcc_json_printer_t *ctx,flatcc_json_printer_table_descriptor_t *td,int id,
               char *name,size_t len,char *fid,flatcc_json_printer_struct_f *pf)

{
  uint *buf;
  int iVar1;
  uint uVar2;
  ulong uVar3;
  uint *puVar4;
  long lVar5;
  char *pcVar6;
  size_t __n;
  size_t __n_00;
  
  uVar2 = id * 2 + 4;
  if ((uVar2 < (uint)td->vsize) &&
     (uVar3 = (ulong)*(ushort *)((long)td->vtable + (ulong)uVar2), uVar3 != 0)) {
    puVar4 = (uint *)(uVar3 + (long)td->table);
  }
  else {
    puVar4 = (uint *)0x0;
  }
  if (puVar4 != (uint *)0x0) {
    buf = (uint *)((ulong)*puVar4 + (long)puVar4);
    accept_header(ctx,buf,(ulong)*(uint *)((ulong)*puVar4 + (long)puVar4),fid);
    iVar1 = td->count;
    td->count = iVar1 + 1;
    if (iVar1 != 0) {
      pcVar6 = ctx->p;
      ctx->p = pcVar6 + 1;
      *pcVar6 = ',';
    }
    print_name(ctx,name,len);
    ctx->level = ctx->level + 1;
    pcVar6 = ctx->p;
    ctx->p = pcVar6 + 1;
    *pcVar6 = '{';
    (*pf)(ctx,(void *)((ulong)*buf + (long)buf));
    if (ctx->indent != '\0') {
      pcVar6 = ctx->p;
      ctx->p = pcVar6 + 1;
      *pcVar6 = '\n';
      lVar5 = (long)ctx->level + -1;
      ctx->level = (int)lVar5;
      __n = (ulong)ctx->indent * lVar5;
      pcVar6 = ctx->p;
      if (ctx->pflush < pcVar6 + __n) {
        if (ctx->pflush <= pcVar6) {
          (*ctx->flush)(ctx,0);
        }
        __n_00 = (long)ctx->pflush - (long)ctx->p;
        if (__n_00 < __n) {
          do {
            memset(ctx->p,0x20,__n_00);
            ctx->p = ctx->p + __n_00;
            __n = __n - __n_00;
            (*ctx->flush)(ctx,0);
            __n_00 = (long)ctx->pflush - (long)ctx->p;
          } while (__n_00 < __n);
        }
        pcVar6 = ctx->p;
      }
      memset(pcVar6,0x20,__n);
      ctx->p = ctx->p + __n;
    }
    pcVar6 = ctx->p;
    ctx->p = pcVar6 + 1;
    *pcVar6 = '}';
  }
  return;
}

Assistant:

void flatcc_json_printer_struct_as_nested_root(flatcc_json_printer_t *ctx,
        flatcc_json_printer_table_descriptor_t *td,
        int id, const char *name, size_t len,
        const char *fid,
        flatcc_json_printer_struct_f *pf)
{
    const uoffset_t *buf;
    uoffset_t bufsiz;

    if (0 == (buf = get_field_ptr(td, id))) {
        return;
    }
    buf = (const uoffset_t *)((size_t)buf + __flatbuffers_uoffset_read_from_pe(buf));
    bufsiz = __flatbuffers_uoffset_read_from_pe(buf);
    if (!accept_header(ctx, buf, bufsiz, fid)) {
        return;
    }
    if (td->count++) {
        print_char(',');
    }
    print_name(ctx, name, len);
    print_start('{');
    pf(ctx, read_uoffset_ptr(buf));
    print_end('}');
}